

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

int netaddr_from_string(netaddr *dst,char *src)

{
  char cVar1;
  netaddr *pnVar2;
  uint8_t uVar3;
  int iVar4;
  ushort **ppuVar5;
  ulong uVar6;
  bool bVar7;
  ulong local_a0;
  size_t i;
  char *ptr3;
  char *ptr2;
  char *ptr1;
  int local_78;
  _Bool last_was_colon;
  _Bool has_point;
  int iStack_74;
  _Bool has_coloncolon;
  int prefix_len;
  int result;
  uint minus_count;
  uint colon_count;
  netaddr_str buf;
  char *src_local;
  netaddr *dst_local;
  
  buf.buf._54_8_ = src;
  memset(dst,0,0x12);
  iVar4 = strcmp((char *)buf.buf._54_8_,"-");
  if (iVar4 == 0) {
    memset(dst,0,0x12);
    dst_local._4_4_ = 0;
  }
  else {
    for (local_a0 = 0; local_a0 < 5; local_a0 = local_a0 + 1) {
      iVar4 = strcasecmp((char *)buf.buf._54_8_,_known_prefixes[local_a0].name);
      if (iVar4 == 0) {
        pnVar2 = _known_prefixes[local_a0].prefix;
        *(undefined8 *)dst->_addr = *(undefined8 *)pnVar2->_addr;
        *(undefined8 *)(dst->_addr + 8) = *(undefined8 *)(pnVar2->_addr + 8);
        uVar3 = pnVar2->_prefix_len;
        dst->_type = pnVar2->_type;
        dst->_prefix_len = uVar3;
        return 0;
      }
    }
    result = 0;
    prefix_len = 0;
    ptr1._7_1_ = 0;
    ptr1._6_1_ = 0;
    ptr1._5_1_ = 0;
    iStack_74 = -1;
    local_78 = -1;
    strscpy((char *)((long)&minus_count + 2),(char *)buf.buf._54_8_,0x3e);
    ptr2 = (char *)((long)&minus_count + 2);
    ptr2 = str_trim(ptr2);
    ptr3 = ptr2;
    while( true ) {
      bVar7 = false;
      if (*ptr3 != '\0') {
        ppuVar5 = __ctype_b_loc();
        bVar7 = false;
        if (((*ppuVar5)[(int)*ptr3] & 0x2000) == 0) {
          bVar7 = *ptr3 != '/';
        }
      }
      if (!bVar7) break;
      cVar1 = *ptr3;
      if (cVar1 == '-') {
        prefix_len = prefix_len + 1;
      }
      else if (cVar1 == '.') {
        ptr1._6_1_ = 1;
      }
      else if (cVar1 == ':') {
        if ((ptr1._5_1_ & 1) != 0) {
          ptr1._7_1_ = 1;
        }
        result = result + 1;
      }
      ptr1._5_1_ = *ptr3 == ':';
      ptr3 = ptr3 + 1;
    }
    if (*ptr3 != '\0') {
      while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*ptr3] & 0x2000) != 0) {
        *ptr3 = '\0';
        ptr3 = ptr3 + 1;
      }
      if (*ptr3 == '/') {
        *ptr3 = '\0';
        ptr3 = ptr3 + 1;
      }
      while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*ptr3] & 0x2000) != 0) {
        *ptr3 = '\0';
        ptr3 = ptr3 + 1;
      }
      if (*ptr3 == '\0') {
        dst->_type = '\0';
        return -1;
      }
      uVar6 = strtoul(ptr3,(char **)&i,10);
      local_78 = (int)uVar6;
      if ((i != 0) && (*(char *)i != '\0')) {
        local_78 = -1;
      }
    }
    if ((((result == 5) || (prefix_len == 5)) && ((result == 0 || (prefix_len == 0)))) &&
       (((ptr1._6_1_ & 1) == 0 && ((ptr1._7_1_ & 1) == 0)))) {
      dst->_type = '/';
      dst->_prefix_len = '0';
      if (result == 0) {
        iStack_74 = _bin_from_hex(dst,6,ptr2,'-');
      }
      else {
        iStack_74 = _bin_from_hex(dst,6,ptr2,':');
      }
    }
    else if ((result == 0) && (((ptr1._6_1_ & 1) == 0 && (prefix_len == 7)))) {
      dst->_type = '0';
      dst->_prefix_len = '@';
      dst->_addr[7] = '\x02';
      iStack_74 = _bin_from_hex(dst,8,ptr2,'-');
    }
    else if ((result == 0) && (((ptr1._6_1_ & 1) != 0 && (prefix_len == 0)))) {
      dst->_type = '\x02';
      dst->_prefix_len = ' ';
      iVar4 = inet_pton(2,ptr2,dst);
      iStack_74 = -1;
      if (iVar4 == 1) {
        iStack_74 = 0;
      }
      if (((iStack_74 == 0) && (*ptr3 != '\0')) && (local_78 == -1)) {
        local_78 = _subnetmask_to_prefixlen(ptr3);
      }
    }
    else if ((((ptr1._7_1_ & 1) == 0) && (result != 7)) || (prefix_len != 0)) {
      if (((prefix_len == 4) && (result == 0)) && ((ptr1._6_1_ & 1) == 0)) {
        dst->_type = '1';
        dst->_prefix_len = 0x80;
        iStack_74 = _uuid_from_string(dst,0x10,ptr2);
      }
    }
    else {
      dst->_type = '\n';
      dst->_prefix_len = 0x80;
      iVar4 = inet_pton(10,ptr2,dst);
      iStack_74 = -1;
      if (iVar4 == 1) {
        iStack_74 = 0;
      }
    }
    if (iStack_74 == 0) {
      if (*ptr3 != '\0') {
        if ((local_78 < 0) || ((int)(uint)dst->_prefix_len < local_78)) {
          dst->_type = '\0';
          return -1;
        }
        dst->_prefix_len = (uint8_t)local_78;
      }
      dst_local._4_4_ = 0;
    }
    else {
      dst->_type = '\0';
      dst_local._4_4_ = -1;
    }
  }
  return dst_local._4_4_;
}

Assistant:

int
netaddr_from_string(struct netaddr *dst, const char *src) {
  struct netaddr_str buf;
  unsigned int colon_count, minus_count;
  int result;
  int prefix_len;
  bool has_coloncolon, has_point;
  bool last_was_colon;
  char *ptr1, *ptr2, *ptr3;
  size_t i;

  memset(dst, 0, sizeof(*dst));

  if (strcmp(src, "-") == 0) {
    /* unspec */
    netaddr_invalidate(dst);
    return 0;
  }

  /* handle string representations of prefixes */
  for (i = 0; i < ARRAYSIZE(_known_prefixes); i++) {
    if (strcasecmp(src, _known_prefixes[i].name) == 0) {
      memcpy(dst, _known_prefixes[i].prefix, sizeof(*dst));
      return 0;
    }
  }

  colon_count = 0;
  minus_count = 0;
  has_coloncolon = false;
  has_point = false;

  last_was_colon = false;

  result = -1;
  prefix_len = -1;

  /* copy input string in temporary buffer */
  strscpy(buf.buf, src, sizeof(buf));
  ptr1 = buf.buf;

  ptr1 = str_trim(ptr1);

  ptr2 = ptr1;
  while (*ptr2 != 0 && !isspace(*ptr2) && *ptr2 != '/') {
    switch (*ptr2) {
      case ':':
        if (last_was_colon) {
          has_coloncolon = true;
        }
        colon_count++;
        break;

      case '.':
        has_point = true;
        break;

      case '-':
        minus_count++;
        break;

      default:
        break;
    }
    last_was_colon = *ptr2++ == ':';
  }

  if (*ptr2) {
    /* split strings */
    while (isspace(*ptr2))
      *ptr2++ = 0;
    if (*ptr2 == '/') {
      *ptr2++ = 0;
    }
    while (isspace(*ptr2))
      *ptr2++ = 0;

    if (*ptr2 == 0) {
      /* prefixlength is missing */
      dst->_type = AF_UNSPEC;
      return -1;
    }

    /* try to read numeric prefix length */
    prefix_len = (int)strtoul(ptr2, &ptr3, 10);
    if (ptr3 && *ptr3) {
      /* not a numeric prefix length */
      prefix_len = -1;
    }
  }

  /* use dst->prefix_len as storage for maximum prefixlen */
  if ((colon_count == 5 || minus_count == 5) && (colon_count == 0 || minus_count == 0) && !has_point &&
      !has_coloncolon) {
    dst->_type = AF_MAC48;
    dst->_prefix_len = 48;
    if (colon_count > 0) {
      result = _bin_from_hex(dst->_addr, 6, ptr1, ':');
    }
    else {
      result = _bin_from_hex(dst->_addr, 6, ptr1, '-');
    }
  }
  else if (colon_count == 0 && !has_point && minus_count == 7) {
    dst->_type = AF_EUI64;
    dst->_prefix_len = 64;
    dst->_addr[7] = 2;
    result = _bin_from_hex(dst->_addr, 8, ptr1, '-');
  }
  else if (colon_count == 0 && has_point && minus_count == 0) {
    dst->_type = AF_INET;
    dst->_prefix_len = 32;
    result = inet_pton(AF_INET, ptr1, dst->_addr) == 1 ? 0 : -1;

    if (result == 0 && *ptr2 && prefix_len == -1) {
      /* we need a prefix length, but its not a numerical one */
      prefix_len = _subnetmask_to_prefixlen(ptr2);
    }
  }
  else if ((has_coloncolon || colon_count == 7) && minus_count == 0) {
    dst->_type = AF_INET6;
    dst->_prefix_len = 128;
    result = inet_pton(AF_INET6, ptr1, dst->_addr) == 1 ? 0 : -1;
  }
  else if (minus_count == 4 && colon_count == 0 && !has_point) {
    dst->_type = AF_UUID;
    dst->_prefix_len = 128;
    result = _uuid_from_string(dst->_addr, sizeof(dst->_addr), ptr1);
  }

  /* stop if an error happened */
  if (result) {
    dst->_type = AF_UNSPEC;
    return -1;
  }

  if (*ptr2) {
    if (prefix_len < 0 || prefix_len > dst->_prefix_len) {
      /* prefix is too long */
      dst->_type = AF_UNSPEC;
      return -1;
    }

    /* store real prefix length */
    dst->_prefix_len = (uint8_t)prefix_len;
  }
  return 0;
}